

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

void bn_mul_part_recursive
               (unsigned_long *r,unsigned_long *a,unsigned_long *b,int n,int tna,int tnb,
               unsigned_long *t)

{
  int num;
  int iVar1;
  int iVar2;
  int iVar3;
  int dnb;
  ulong uVar4;
  int in_ECX;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  ulong *in_RDI;
  int in_R8D;
  int in_R9D;
  unsigned_long *unaff_retaddr;
  ulong *in_stack_00000008;
  unsigned_long *p;
  unsigned_long lo;
  unsigned_long ln;
  int neg;
  int c2;
  int c1;
  int n2;
  int j;
  int i;
  unsigned_long *in_stack_00000328;
  unsigned_long *in_stack_00000330;
  unsigned_long *in_stack_00000338;
  undefined8 in_stack_ffffffffffffff98;
  unsigned_long *in_stack_ffffffffffffffa0;
  unsigned_long *in_stack_ffffffffffffffa8;
  ulong *puVar5;
  int iVar6;
  undefined8 in_stack_ffffffffffffffb0;
  unsigned_long *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int na;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  
  num = in_ECX << 1;
  if (in_ECX < 8) {
    bn_mul_normal((unsigned_long *)CONCAT44(in_stack_ffffffffffffffd4,num),
                  (unsigned_long *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                  (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  else {
    iVar1 = bn_cmp_part_words(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                              (int)in_stack_ffffffffffffff98);
    iVar2 = bn_cmp_part_words(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                              (int)in_stack_ffffffffffffff98);
    na = 0;
    iVar6 = (int)in_stack_ffffffffffffffb0;
    iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    switch(iVar2 + 4 + iVar1 * 3) {
    case 0:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        iVar3,iVar6);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(na,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
      break;
    case 1:
    case 2:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        iVar3,iVar6);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(na,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
      na = 1;
      break;
    case 3:
    case 4:
    case 5:
    case 6:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        iVar3,iVar6);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(na,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
      na = 1;
      break;
    case 7:
    case 8:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        iVar3,iVar6);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(na,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
    }
    iVar6 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    if (in_ECX == 8) {
      bn_mul_comba8(in_stack_00000338,in_stack_00000330,in_stack_00000328);
      bn_mul_comba8(in_stack_00000338,in_stack_00000330,in_stack_00000328);
      bn_mul_normal((unsigned_long *)CONCAT44(in_stack_ffffffffffffffd4,num),
                    (unsigned_long *)CONCAT44(iVar1,iVar2),na,in_stack_ffffffffffffffb8,iVar6);
      memset(in_RDI + (num + in_R8D + in_R9D),0,(long)((num - in_R8D) - in_R9D) << 3);
    }
    else {
      bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,
                       in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,unaff_retaddr);
      bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,
                       in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,unaff_retaddr);
      iVar3 = in_ECX / 2;
      if (in_R9D < in_R8D) {
        dnb = in_R8D - iVar3;
      }
      else {
        dnb = in_R9D - iVar3;
      }
      if (dnb == 0) {
        bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,iVar3,0,
                         unaff_retaddr);
        memset(in_RDI + (num + iVar3 * 2),0,(long)(num + iVar3 * -2) << 3);
      }
      else if (dnb < 1) {
        memset(in_RDI + num,0,(long)num << 3);
        if ((in_R8D < 0x10) && (in_R9D < 0x10)) {
          bn_mul_normal((unsigned_long *)CONCAT44(dnb,num),(unsigned_long *)CONCAT44(iVar1,iVar2),na
                        ,in_stack_ffffffffffffffb8,iVar6);
        }
        else {
          do {
            iVar3 = iVar3 / 2;
            if ((iVar3 < in_R8D) || (iVar3 < in_R9D)) {
              bn_mul_part_recursive
                        (in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,iVar3,dnb,
                         unaff_retaddr);
              goto LAB_00119ed7;
            }
          } while ((iVar3 != in_R8D) && (iVar3 != in_R9D));
          bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,iVar3,dnb,
                           unaff_retaddr);
        }
      }
      else {
        bn_mul_part_recursive
                  (in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,iVar3,dnb,
                   unaff_retaddr);
        memset(in_RDI + (num + in_R8D + in_R9D),0,(long)((num - in_R8D) - in_R9D) << 3);
      }
    }
LAB_00119ed7:
    uVar4 = bn_add_words(in_stack_00000008,in_RDI,in_RDI + num,num);
    iVar1 = (int)uVar4;
    if (na == 0) {
      uVar4 = bn_add_words(in_stack_00000008 + num,in_stack_00000008 + num,in_stack_00000008,num);
      iVar1 = (int)uVar4 + iVar1;
    }
    else {
      uVar4 = bn_sub_words(in_stack_00000008 + num,in_stack_00000008,in_stack_00000008 + num,num);
      iVar1 = iVar1 - (int)uVar4;
    }
    uVar4 = bn_add_words(in_RDI + in_ECX,in_RDI + in_ECX,in_stack_00000008 + num,num);
    iVar1 = (int)uVar4 + iVar1;
    if (iVar1 != 0) {
      puVar5 = in_RDI + (in_ECX + num);
      uVar4 = *puVar5;
      *puVar5 = uVar4 + (long)iVar1;
      if (uVar4 + (long)iVar1 < (ulong)(long)iVar1) {
        do {
          puVar5 = puVar5 + 1;
          uVar4 = *puVar5;
          *puVar5 = uVar4 + 1;
        } while (uVar4 + 1 == 0);
      }
    }
  }
  return;
}

Assistant:

void bn_mul_part_recursive(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, int n,
                           int tna, int tnb, BN_ULONG *t)
{
    int i, j, n2 = n * 2;
    int c1, c2, neg;
    BN_ULONG ln, lo, *p;

    if (n < 8) {
        bn_mul_normal(r, a, n + tna, b, n + tnb);
        return;
    }

    /* r=(a[0]-a[1])*(b[1]-b[0]) */
    c1 = bn_cmp_part_words(a, &(a[n]), tna, n - tna);
    c2 = bn_cmp_part_words(&(b[n]), b, tnb, tnb - n);
    neg = 0;
    switch (c1 * 3 + c2) {
    case -4:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        break;
    case -3:
        /* break; */
    case -2:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n); /* + */
        neg = 1;
        break;
    case -1:
    case 0:
    case 1:
        /* break; */
    case 2:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna); /* + */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        neg = 1;
        break;
    case 3:
        /* break; */
    case 4:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna);
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n);
        break;
    }
    /*
     * The zero case isn't yet implemented here. The speedup would probably
     * be negligible.
     */
# if 0
    if (n == 4) {
        bn_mul_comba4(&(t[n2]), t, &(t[n]));
        bn_mul_comba4(r, a, b);
        bn_mul_normal(&(r[n2]), &(a[n]), tn, &(b[n]), tn);
        memset(&r[n2 + tn * 2], 0, sizeof(*r) * (n2 - tn * 2));
    } else
# endif
    if (n == 8) {
        bn_mul_comba8(&(t[n2]), t, &(t[n]));
        bn_mul_comba8(r, a, b);
        bn_mul_normal(&(r[n2]), &(a[n]), tna, &(b[n]), tnb);
        memset(&r[n2 + tna + tnb], 0, sizeof(*r) * (n2 - tna - tnb));
    } else {
        p = &(t[n2 * 2]);
        bn_mul_recursive(&(t[n2]), t, &(t[n]), n, 0, 0, p);
        bn_mul_recursive(r, a, b, n, 0, 0, p);
        i = n / 2;
        /*
         * If there is only a bottom half to the number, just do it
         */
        if (tna > tnb)
            j = tna - i;
        else
            j = tnb - i;
        if (j == 0) {
            bn_mul_recursive(&(r[n2]), &(a[n]), &(b[n]),
                             i, tna - i, tnb - i, p);
            memset(&r[n2 + i * 2], 0, sizeof(*r) * (n2 - i * 2));
        } else if (j > 0) {     /* eg, n == 16, i == 8 and tn == 11 */
            bn_mul_part_recursive(&(r[n2]), &(a[n]), &(b[n]),
                                  i, tna - i, tnb - i, p);
            memset(&(r[n2 + tna + tnb]), 0,
                   sizeof(BN_ULONG) * (n2 - tna - tnb));
        } else {                /* (j < 0) eg, n == 16, i == 8 and tn == 5 */

            memset(&r[n2], 0, sizeof(*r) * n2);
            if (tna < BN_MUL_RECURSIVE_SIZE_NORMAL
                && tnb < BN_MUL_RECURSIVE_SIZE_NORMAL) {
                bn_mul_normal(&(r[n2]), &(a[n]), tna, &(b[n]), tnb);
            } else {
                for (;;) {
                    i /= 2;
                    /*
                     * these simplified conditions work exclusively because
                     * difference between tna and tnb is 1 or 0
                     */
                    if (i < tna || i < tnb) {
                        bn_mul_part_recursive(&(r[n2]),
                                              &(a[n]), &(b[n]),
                                              i, tna - i, tnb - i, p);
                        break;
                    } else if (i == tna || i == tnb) {
                        bn_mul_recursive(&(r[n2]),
                                         &(a[n]), &(b[n]),
                                         i, tna - i, tnb - i, p);
                        break;
                    }
                }
            }
        }
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0]), c1 is the sign
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     */

    c1 = (int)(bn_add_words(t, r, &(r[n2]), n2));

    if (neg) {                  /* if t[32] is negative */
        c1 -= (int)(bn_sub_words(&(t[n2]), t, &(t[n2]), n2));
    } else {
        /* Might have a carry */
        c1 += (int)(bn_add_words(&(t[n2]), &(t[n2]), t, n2));
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0])+(a[0]*b[0])+(a[1]*b[1])
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     * c1 holds the carry bits
     */
    c1 += (int)(bn_add_words(&(r[n]), &(r[n]), &(t[n2]), n2));
    if (c1) {
        p = &(r[n + n2]);
        lo = *p;
        ln = (lo + c1) & BN_MASK2;
        *p = ln;

        /*
         * The overflow will stop before we over write words we should not
         * overwrite
         */
        if (ln < (BN_ULONG)c1) {
            do {
                p++;
                lo = *p;
                ln = (lo + 1) & BN_MASK2;
                *p = ln;
            } while (ln == 0);
        }
    }
}